

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCanon.c
# Opt level: O3

Ivy_Obj_t * Ivy_CanonPair_rec(Ivy_Man_t *p,Ivy_Obj_t *pGhost)

{
  Ivy_Obj_t *pIVar1;
  Ivy_Init_t IVar2;
  Ivy_Init_t IVar3;
  Ivy_Obj_t *pIVar4;
  Ivy_Init_t Init;
  uint fCompl;
  int *piVar5;
  uint fCompl_00;
  int *piVar6;
  Ivy_Type_t Type;
  
  Type = *(Ivy_Type_t *)&pGhost->field_0x8 & (IVY_VOID|IVY_BUF);
  if (Type - IVY_BUF < 0xfffffffe) {
    __assert_fail("Ivy_ObjIsNode(pGhost)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCanon.c"
                  ,0x35,"Ivy_Obj_t *Ivy_CanonPair_rec(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  pIVar4 = pGhost->pFanin0;
  if ((Type != IVY_AND) && ((((ulong)pIVar4 & 1) != 0 || (((ulong)pGhost->pFanin1 & 1) != 0)))) {
    __assert_fail("Ivy_ObjIsAnd(pGhost) || (!Ivy_ObjFaninC0(pGhost) && !Ivy_ObjFaninC1(pGhost))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCanon.c"
                  ,0x36,"Ivy_Obj_t *Ivy_CanonPair_rec(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  if ((((pIVar4 != (Ivy_Obj_t *)0x0) &&
       (piVar5 = (int *)((ulong)pIVar4 & 0xfffffffffffffffe), *piVar5 != 0)) &&
      (pIVar1 = pGhost->pFanin1, pIVar1 != (Ivy_Obj_t *)0x0)) &&
     (piVar6 = (int *)((ulong)pIVar1 & 0xfffffffffffffffe), *piVar6 != 0)) {
    if (((piVar5[2] & 0xfU) == 4) && ((piVar6[2] & 0xfU) == 4)) {
      fCompl_00 = (uint)pIVar4 & 1;
      fCompl = (uint)pIVar1 & 1;
      pIVar4 = Ivy_Oper(p,(Ivy_Obj_t *)
                          ((ulong)fCompl_00 + (*(ulong *)(piVar5 + 4) & 0xfffffffffffffffe)),
                        (Ivy_Obj_t *)((ulong)fCompl + (*(ulong *)(piVar6 + 4) & 0xfffffffffffffffe))
                        ,Type);
      IVar2 = Ivy_InitNotCond((uint)piVar5[2] >> 9 & IVY_INIT_DC,fCompl_00);
      IVar3 = Ivy_InitNotCond((uint)piVar6[2] >> 9 & IVY_INIT_DC,fCompl);
      if (Type == IVY_AND) {
        Init = (IVar3 == IVY_INIT_DC || IVar2 == IVY_INIT_DC) | IVY_INIT_1;
        if (IVar3 == IVY_INIT_0) {
          Init = IVY_INIT_0;
        }
        if (IVar2 == IVY_INIT_0) {
          Init = IVY_INIT_0;
        }
      }
      else {
        Init = IVY_INIT_DC;
        if (((IVar2 != IVY_INIT_DC) && (Init = IVY_INIT_DC, IVar3 != IVY_INIT_DC)) &&
           ((IVar2 != IVY_INIT_0 || (Init = IVY_INIT_1, IVar3 != IVY_INIT_1)))) {
          Init = (IVar3 == IVY_INIT_0 && IVar2 == IVY_INIT_1) + IVY_INIT_0;
        }
      }
      pIVar4 = Ivy_Latch(p,pIVar4,Init);
      return pIVar4;
    }
    pIVar4 = Ivy_TableLookup(p,pGhost);
    if (pIVar4 == (Ivy_Obj_t *)0x0) {
      pIVar4 = Ivy_ObjCreate(p,pGhost);
      return pIVar4;
    }
    return pIVar4;
  }
  __assert_fail("Ivy_ObjFaninId0(pGhost) != 0 && Ivy_ObjFaninId1(pGhost) != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCanon.c"
                ,0x37,"Ivy_Obj_t *Ivy_CanonPair_rec(Ivy_Man_t *, Ivy_Obj_t *)");
}

Assistant:

Ivy_Obj_t * Ivy_CanonPair_rec( Ivy_Man_t * p, Ivy_Obj_t * pGhost )
{
    Ivy_Obj_t * pResult, * pLat0, * pLat1;
    Ivy_Init_t Init, Init0, Init1;
    int fCompl0, fCompl1;
    Ivy_Type_t Type;
    assert( Ivy_ObjIsNode(pGhost) );
    assert( Ivy_ObjIsAnd(pGhost) || (!Ivy_ObjFaninC0(pGhost) && !Ivy_ObjFaninC1(pGhost)) );
    assert( Ivy_ObjFaninId0(pGhost) != 0 && Ivy_ObjFaninId1(pGhost) != 0 );
    // consider the case when the pair is canonical
    if ( !Ivy_ObjIsLatch(Ivy_ObjFanin0(pGhost)) || !Ivy_ObjIsLatch(Ivy_ObjFanin1(pGhost)) )
    {
        if ( (pResult = Ivy_TableLookup( p, pGhost )) )
            return pResult;
        return Ivy_ObjCreate( p, pGhost );
    }
    /// remember the latches
    pLat0 = Ivy_ObjFanin0(pGhost);
    pLat1 = Ivy_ObjFanin1(pGhost);
    // remember type and compls
    Type = Ivy_ObjType(pGhost);
    fCompl0 = Ivy_ObjFaninC0(pGhost);
    fCompl1 = Ivy_ObjFaninC1(pGhost);
    // call recursively
    pResult = Ivy_Oper( p, Ivy_NotCond(Ivy_ObjFanin0(pLat0), fCompl0), Ivy_NotCond(Ivy_ObjFanin0(pLat1), fCompl1), Type );
    // build latch on top of this
    Init0 = Ivy_InitNotCond( Ivy_ObjInit(pLat0), fCompl0 );
    Init1 = Ivy_InitNotCond( Ivy_ObjInit(pLat1), fCompl1 );
    Init  = (Type == IVY_AND)? Ivy_InitAnd(Init0, Init1) : Ivy_InitExor(Init0, Init1);
    return Ivy_Latch( p, pResult, Init );
}